

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsMatchingBasicType
          (UniformCollection *this,dataTypePredicate predicate)

{
  bool bVar1;
  pointer pUVar2;
  long lVar3;
  long lVar4;
  
  pUVar2 = (this->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_uniforms).
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 3) *
      -0x49249249 < 1) {
    bVar1 = false;
  }
  else {
    lVar4 = 0x20;
    lVar3 = 0;
    do {
      bVar1 = typeContainsMatchingBasicType
                        ((VarType *)((long)&(pUVar2->name)._M_dataplus + lVar4),predicate);
      if (bVar1) {
        return bVar1;
      }
      lVar3 = lVar3 + 1;
      pUVar2 = (this->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < (int)((ulong)((long)(this->m_uniforms).
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2)
                          >> 3) * -0x49249249);
  }
  return bVar1;
}

Assistant:

bool containsMatchingBasicType (const dataTypePredicate predicate) const
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			if (typeContainsMatchingBasicType(m_uniforms[i].type, predicate))
				return true;
		return false;
	}